

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_PLYReader_::read_ascii
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *this_01;
  bool bVar1;
  VertexHandle _vh;
  uint uVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mostream *pmVar5;
  ostream *poVar6;
  int *piVar7;
  _PLYReader_ *this_02;
  uint propertyIndex;
  float fVar8;
  uint uVar9;
  size_type *local_e8;
  string trash;
  VHandles vhandles;
  undefined4 local_a4;
  undefined4 local_a0;
  uint k;
  uint l;
  uint idx;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  uint local_60;
  int iStack_5c;
  uint nV;
  Vec4i c;
  uint j;
  float local_3c;
  float local_38;
  float tmp;
  
  bVar1 = can_u_read(this,_in);
  if (bVar1) {
    local_e8 = &trash._M_string_length;
    trash._M_dataplus._M_p = (pointer)0x0;
    trash._M_string_length._0_1_ = 0;
    trash.field_2._8_8_ = 0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unique0x10000705 = _bi;
    (*_bi->_vptr_BaseImporter[0x1b])
              (_bi,(ulong)this->vertexCount_,(ulong)(this->vertexCount_ * 3),(ulong)this->faceCount_
              );
    bVar1 = this->vertexDimension_ == 3;
    if (bVar1) {
      this_00 = &this->vertexPropertyMap_;
      uVar9 = 0;
      while ((uVar9 < this->vertexCount_ &&
             (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) == 0))) {
        _vh.super_BaseHandle.idx_ = (BaseHandle)(*stack0xffffffffffffffb8->_vptr_BaseImporter[3])();
        _l = 0;
        v.super_VectorDataT<float,_3>.values_[0] = 0.0;
        v.super_VectorDataT<float,_3>.values_[1] = 0.0;
        v.super_VectorDataT<float,_3>.values_[2] = 0.0;
        n.super_VectorDataT<float,_3>.values_[0] = 0.0;
        n.super_VectorDataT<float,_3>.values_[1] = 0.0;
        n.super_VectorDataT<float,_3>.values_[2] = 0.0;
        iStack_5c = 0;
        nV = 0;
        c.super_VectorDataT<int,_4>.values_[0] = 0;
        c.super_VectorDataT<int,_4>.values_[1] = 0xff;
        for (fVar8 = 0.0; (uint)fVar8 < this->vertexPropertyCount_; fVar8 = (float)((int)fVar8 + 1))
        {
          tmp = fVar8;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&tmp);
          switch(pmVar3->property) {
          case XCOORD:
            break;
          case YCOORD:
            break;
          case ZCOORD:
            break;
          case TEXX:
            break;
          case TEXY:
            break;
          case COLORRED:
            tmp = fVar8;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&tmp);
            if (pmVar3->value != ValueTypeFLOAT32) {
              local_38 = fVar8;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,(key_type *)&local_38);
              piVar7 = &iStack_5c;
              if (pmVar3->value != ValueTypeFLOAT) {
LAB_00199f52:
                std::istream::operator>>(_in,piVar7);
                goto LAB_00199ef8;
              }
            }
            std::istream::_M_extract<float>((float *)_in);
            iStack_5c = (int)(local_3c * 255.0);
            goto LAB_00199ef8;
          case COLORGREEN:
            tmp = fVar8;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&tmp);
            if (pmVar3->value != ValueTypeFLOAT32) {
              local_38 = fVar8;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,(key_type *)&local_38);
              piVar7 = (int *)&nV;
              if (pmVar3->value != ValueTypeFLOAT) goto LAB_00199f52;
            }
            std::istream::_M_extract<float>((float *)_in);
            nV = (uint)(local_3c * 255.0);
            goto LAB_00199ef8;
          case COLORBLUE:
            tmp = fVar8;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&tmp);
            if (pmVar3->value != ValueTypeFLOAT32) {
              local_38 = fVar8;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,(key_type *)&local_38);
              piVar7 = (int *)&c;
              if (pmVar3->value != ValueTypeFLOAT) goto LAB_00199f52;
            }
            std::istream::_M_extract<float>((float *)_in);
            c.super_VectorDataT<int,_4>.values_[0] = (int)(local_3c * 255.0);
            goto LAB_00199ef8;
          case COLORALPHA:
            tmp = fVar8;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&tmp);
            if (pmVar3->value != ValueTypeFLOAT32) {
              local_38 = fVar8;
              pmVar3 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,(key_type *)&local_38);
              piVar7 = c.super_VectorDataT<int,_4>.values_ + 1;
              if (pmVar3->value != ValueTypeFLOAT) goto LAB_00199f52;
            }
            std::istream::_M_extract<float>((float *)_in);
            c.super_VectorDataT<int,_4>.values_[1] = (int)(local_3c * 255.0);
            goto LAB_00199ef8;
          case XNORM:
            break;
          case YNORM:
            break;
          case ZNORM:
            break;
          case CUSTOM_PROP:
            if ((_opt->flags_ & 0x2000) == 0) goto LAB_00199db2;
            tmp = fVar8;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&tmp);
            this_02 = (_PLYReader_ *)this_00;
            local_38 = fVar8;
            pmVar4 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_38);
            readCustomProperty(this_02,_in,stack0xffffffffffffffb8,_vh,&pmVar3->name,pmVar4->value);
            goto LAB_00199ef8;
          default:
LAB_00199db2:
            std::operator>>(_in,(string *)&local_e8);
            goto LAB_00199ef8;
          }
          std::istream::_M_extract<float>((float *)_in);
LAB_00199ef8:
        }
        (*stack0xffffffffffffffb8->_vptr_BaseImporter[7])
                  (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,&l);
        uVar2 = _opt->flags_;
        if ((uVar2 & 0x10) != 0) {
          (*stack0xffffffffffffffb8->_vptr_BaseImporter[8])
                    (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,
                     v.super_VectorDataT<float,_3>.values_ + 1);
          uVar2 = _opt->flags_;
        }
        if ((uVar2 & 0x40) != 0) {
          (*stack0xffffffffffffffb8->_vptr_BaseImporter[0xd])
                    (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,
                     n.super_VectorDataT<float,_3>.values_ + 1);
          uVar2 = _opt->flags_;
        }
        if ((uVar2 & 0x20) != 0) {
          tmp = (float)CONCAT13((undefined1)c.super_VectorDataT<int,_4>.values_[1],
                                CONCAT12((undefined1)c.super_VectorDataT<int,_4>.values_[0],
                                         CONCAT11((undefined1)nV,(char)iStack_5c)));
          (*stack0xffffffffffffffb8->_vptr_BaseImporter[10])
                    (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,&tmp);
        }
        uVar9 = uVar9 + 1;
      }
      this_01 = (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                ((long)&trash.field_2 + 8);
      for (uVar9 = 0; uVar9 < this->faceCount_; uVar9 = uVar9 + 1) {
        std::istream::_M_extract<unsigned_int>((uint *)_in);
        if (local_60 == 3) {
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                    (this_01,3);
          std::istream::_M_extract<unsigned_int>((uint *)_in);
          std::istream::_M_extract<unsigned_int>((uint *)_in);
          std::istream::_M_extract<unsigned_int>((uint *)_in);
          *(int *)trash.field_2._8_8_ = c.super_VectorDataT<int,_4>.values_[2];
          *(undefined4 *)(trash.field_2._8_8_ + 4) = local_a4;
          *(undefined4 *)(trash.field_2._8_8_ + 8) = local_a0;
        }
        else {
          if (vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)trash.field_2._8_8_) {
            vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)trash.field_2._8_8_;
          }
          for (c.super_VectorDataT<int,_4>.values_[2] = 0;
              (uint)c.super_VectorDataT<int,_4>.values_[2] < local_60;
              c.super_VectorDataT<int,_4>.values_[2] = c.super_VectorDataT<int,_4>.values_[2] + 1) {
            std::istream::_M_extract<unsigned_int>((uint *)_in);
            tmp = (float)k;
            std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
            emplace_back<OpenMesh::VertexHandle>(this_01,(VertexHandle *)&tmp);
          }
        }
        (*stack0xffffffffffffffb8->_vptr_BaseImporter[4])(stack0xffffffffffffffb8,this_01);
      }
    }
    else {
      pmVar5 = omerr();
      poVar6 = std::operator<<(&pmVar5->super_ostream,
                               "[PLYReader] : Only vertex dimension 3 is supported.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
    ~_Vector_base((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                  ((long)&trash.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    pmVar5 = omerr();
    std::operator<<(&pmVar5->super_ostream,"[PLYReader] : Unable to parse header\n");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool _PLYReader_::read_ascii(std::istream& _in, BaseImporter& _bi, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f v, n;
    std::string trash;
    OpenMesh::Vec2f t;
    OpenMesh::Vec4i c;
    float tmp;
    BaseImporter::VHandles vhandles;
    VertexHandle vh;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    if (vertexDimension_ != 3) {
        omerr() << "[PLYReader] : Only vertex dimension 3 is supported." << std::endl;
        return false;
    }

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        vh = _bi.add_vertex();

        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                _in >> v[0];
                break;
            case YCOORD:
                _in >> v[1];
                break;
            case ZCOORD:
                _in >> v[2];
                break;
            case XNORM:
                _in >> n[0];
                break;
            case YNORM:
                _in >> n[1];
                break;
            case ZNORM:
                _in >> n[2];
                break;
            case TEXX:
                _in >> t[0];
                break;
            case TEXY:
                _in >> t[1];
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[0];
                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[1];
                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[2];
                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[3];
                break;
            case CUSTOM_PROP:
                if (_opt.check(Options::Custom))
                  readCustomProperty(_in, _bi, vh, vertexPropertyMap_[propertyIndex].name, vertexPropertyMap_[propertyIndex].value);
                else
                  _in >> trash;
                break;
            default:
                _in >> trash;
                break;
            }
        }

        _bi.set_point(vh, v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    // faces
    // #N <v1> <v2> .. <v(n-1)> [color spec]
    for (i = 0; i < faceCount_; ++i) {
        // nV = number of Vertices for current face
        _in >> nV;

        if (nV == 3) {
            vhandles.resize(3);
            _in >> j;
            _in >> k;
            _in >> l;

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                _in >> idx;
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);

    }

    // File was successfully parsed.
    return true;
}